

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

char * get_line(char *buf,int len,FILE *input)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  undefined4 in_register_00000034;
  
  __s = fgets(buf,5000,(FILE *)CONCAT44(in_register_00000034,len));
  if (__s != (char *)0x0) {
    bVar2 = false;
    do {
      sVar3 = strlen(__s);
      if (sVar3 == 0) {
        bVar2 = true;
      }
      else {
        bVar1 = (bool)(bVar2 | __s[sVar3 - 1] != '\n');
        bVar2 = __s[sVar3 - 1] != '\n';
        if (!bVar1) {
          return __s;
        }
      }
      __s = fgets(buf,5000,(FILE *)CONCAT44(in_register_00000034,len));
    } while (__s != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}